

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this,ContextScopeBase *other)

{
  iterator __position;
  long *in_FS_OFFSET;
  ContextScopeBase *local_18;
  
  (this->super_IContextScope)._vptr_IContextScope = (_func_int **)&PTR__IContextScope_00129be0;
  this->need_to_destroy = true;
  if (other->need_to_destroy == true) {
    destroy(other);
  }
  other->need_to_destroy = false;
  g_infoContexts::__tls_init();
  __position._M_current = (IContextScope **)in_FS_OFFSET[-5];
  if (__position._M_current == (IContextScope **)in_FS_OFFSET[-4]) {
    local_18 = this;
    std::vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>>::
    _M_realloc_insert<doctest::IContextScope*>
              ((vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>> *)
               (*in_FS_OFFSET + -0x30),__position,(IContextScope **)&local_18);
  }
  else {
    *__position._M_current = &this->super_IContextScope;
    in_FS_OFFSET[-5] = in_FS_OFFSET[-5] + 8;
  }
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase(ContextScopeBase&& other) {
        if (other.need_to_destroy) {
            other.destroy();
        }
        other.need_to_destroy = false;
        g_infoContexts.push_back(this);
    }